

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O1

void * MPIU_Scatter(MPI_Comm comm,int root,void *sendbuffer,void *recvbuffer,int nrecv,size_t elsize
                   ,int *totalnsend)

{
  void *pvVar1;
  undefined8 uVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  long lVar8;
  int *piVar9;
  long lVar10;
  int aiStack_a0 [10];
  undefined8 local_78;
  MPI_Datatype dtype;
  void *local_68;
  void *local_60;
  undefined1 *local_58;
  size_t local_50;
  undefined8 local_48;
  int local_3c;
  uint local_38;
  int ThisTask;
  int NTask;
  int nrecv_local;
  
  local_48 = CONCAT44(in_register_00000034,root);
  aiStack_a0[8] = 0x10597e;
  aiStack_a0[9] = 0;
  local_68 = recvbuffer;
  local_60 = sendbuffer;
  ThisTask = nrecv;
  MPI_Comm_size();
  aiStack_a0[8] = 0x10598a;
  aiStack_a0[9] = 0;
  MPI_Comm_rank(comm,&local_3c);
  aiStack_a0[8] = 0x1059a3;
  aiStack_a0[9] = 0;
  local_50 = elsize;
  MPI_Type_contiguous(elsize & 0xffffffff,&ompi_mpi_byte,&local_78);
  aiStack_a0[8] = 0x1059ab;
  aiStack_a0[9] = 0;
  MPI_Type_commit(&local_78);
  lVar10 = (long)&local_78 - ((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
  uVar7 = (ulong)(local_38 + 1) * 4 + 0xf & 0xfffffffffffffff0;
  piVar9 = (int *)(lVar10 - uVar7);
  dtype = (MPI_Datatype)comm;
  local_58 = (undefined1 *)&local_78;
  *(MPI_Comm *)(piVar9 + -2) = comm;
  *(undefined8 *)(piVar9 + -4) = local_48;
  piVar9[-6] = 0x105a11;
  piVar9[-5] = 0;
  MPI_Gather(&ThisTask,1,&ompi_mpi_int,lVar10,1,&ompi_mpi_int);
  *(undefined4 *)(lVar10 - uVar7) = 0;
  uVar7 = (ulong)local_38;
  if (0 < (int)local_38) {
    iVar4 = *piVar9;
    uVar6 = 0;
    do {
      iVar4 = iVar4 + *(int *)(lVar10 + uVar6 * 4);
      piVar9[uVar6 + 1] = iVar4;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  pvVar3 = local_68;
  if (local_68 == (void *)0x0) {
    lVar8 = (long)ThisTask * local_50;
    piVar9[-2] = 0x105a71;
    piVar9[-1] = 0;
    pvVar3 = (void *)(*(code *)_MPIUMem_0)
                               ("recvbuffer",lVar8,
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/mp-mpiu.c"
                                ,0x14f,_MPIUMem_2);
  }
  iVar4 = ThisTask;
  uVar2 = local_48;
  pvVar1 = local_60;
  if (local_3c == (int)local_48) {
    if (totalnsend == (int *)0x0) goto LAB_00105a9a;
    iVar5 = piVar9[(int)local_38];
  }
  else {
    iVar5 = 0;
    if (totalnsend == (int *)0x0) goto LAB_00105a9a;
  }
  *totalnsend = iVar5;
LAB_00105a9a:
  *(MPI_Datatype *)(piVar9 + -4) = dtype;
  *(undefined8 *)(piVar9 + -6) = uVar2;
  *(undefined8 *)(piVar9 + -8) = local_78;
  piVar9[-10] = 0x105ac1;
  piVar9[-9] = 0;
  MPI_Scatterv(pvVar1,lVar10,piVar9,local_78,pvVar3,iVar4);
  piVar9[-2] = 0x105acd;
  piVar9[-1] = 0;
  MPI_Type_free(&local_78);
  return pvVar3;
}

Assistant:

void *
MPIU_Scatter (MPI_Comm comm, int root, const void * sendbuffer, void * recvbuffer, int nrecv, size_t elsize, int * totalnsend)
{
    int NTask;
    int ThisTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    MPI_Datatype dtype;
    MPI_Type_contiguous(elsize, MPI_BYTE, &dtype);
    MPI_Type_commit(&dtype);

    int sendcount[NTask];
    int sdispls[NTask + 1];
    int i;

    MPI_Gather(&nrecv, 1, MPI_INT, sendcount, 1, MPI_INT, root, comm);

    sdispls[0] = 0;
    for(i = 1; i <= NTask; i ++) {
        sdispls[i] = sdispls[i - 1] + sendcount[i - 1];
    }

    if(recvbuffer == NULL)
        recvbuffer = MPIU_Malloc("recvbuffer", elsize, nrecv);

    if(ThisTask == root) {
        if(totalnsend)
            *totalnsend = sdispls[NTask];
    } else {
        if(totalnsend)
            *totalnsend = 0;
    }
    MPI_Scatterv(sendbuffer, sendcount, sdispls, dtype, recvbuffer, nrecv, dtype, root, comm);

    MPI_Type_free(&dtype);

    return recvbuffer;
}